

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool fs_validate_filename(string *filename)

{
  char32_t cVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  reference pcVar5;
  char *pcVar6;
  char *in_RDI;
  char32_t c;
  iterator __end1;
  iterator __begin1;
  u32string *__range1;
  exception *anon_var_0;
  string filename_reencoded;
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  converter;
  u32string filename_utf32;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  *this;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  in_stack_ffffffffffffff00;
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  *in_stack_ffffffffffffff08;
  string local_e0 [8];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffff28;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffff30;
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  local_c0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  char *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 0) {
    local_1 = 0;
  }
  else {
    uVar4 = std::__cxx11::string::length();
    if (uVar4 < 0x100) {
      std::__cxx11::u32string::u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_ffffffffffffff00._M_current);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
      ::wstring_convert((wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
                         *)in_stack_ffffffffffffff00._M_current);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
      ::from_bytes(in_stack_ffffffffffffff08,(byte_string *)in_stack_ffffffffffffff00._M_current);
      this_00 = &local_30;
      this = &local_c0;
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 this);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
      ::to_bytes(in_stack_ffffffffffffff08,(wide_string *)in_stack_ffffffffffffff00._M_current);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8))
      ;
      if (bVar2) {
        local_1 = 0;
      }
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::
      wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
      ::~wstring_convert(this);
      if (!bVar2) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::begin((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::end(this_00);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                   *)this,(__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                           *)CONCAT17(in_stack_fffffffffffffedf,
                                                      in_stack_fffffffffffffed8)), bVar2) {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                   ::operator*((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                *)&stack0xffffffffffffff00);
          cVar1 = *pcVar5;
          if (((((((uint)cVar1 < 0x20) || (cVar1 == L'\x7f')) ||
                ((0x7f < (uint)cVar1 && ((uint)cVar1 < 0xa0)))) ||
               ((cVar1 == L'．' || (cVar1 == L'∕')))) ||
              ((cVar1 == L'∖' ||
               ((((0xd7ff < (uint)cVar1 && ((uint)cVar1 < 0xe000)) || (cVar1 == L'�')) ||
                (((cVar1 == L'\xfeff' || (cVar1 == L'/')) ||
                 ((cVar1 == L'\\' || ((cVar1 == L':' || (cVar1 == L'*')))))))))))) ||
             ((cVar1 == L'?' ||
              ((((cVar1 == L'\"' || (cVar1 == L'<')) || (cVar1 == L'>')) || (cVar1 == L'|')))))) {
            local_1 = 0;
            goto LAB_002bccb9;
          }
          __gnu_cxx::
          __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          ::operator++((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        *)&stack0xffffffffffffff00);
        }
        pcVar6 = (char *)std::__cxx11::string::front();
        if (((*pcVar6 == ' ') || (pcVar6 = (char *)std::__cxx11::string::back(), *pcVar6 == ' ')) ||
           (pcVar6 = (char *)std::__cxx11::string::back(), *pcVar6 == '.')) {
          local_1 = 0;
        }
        else {
          lVar3 = std::__cxx11::string::find(local_10,0x302c6e);
          if (lVar3 == -1) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this,(char *)CONCAT17(in_stack_fffffffffffffedf,
                                                             in_stack_fffffffffffffed8));
            if (bVar2) {
              local_1 = 0;
            }
            else {
              local_1 = 1;
            }
          }
          else {
            local_1 = 0;
          }
        }
      }
LAB_002bccb9:
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 this);
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool fs_validate_filename(const std::string & filename) {
    if (!filename.length()) {
        // Empty filename invalid
        return false;
    }
    if (filename.length() > 255) {
        // Limit at common largest possible filename on Linux filesystems
        // to avoid unnecessary further validation
        // (On systems with smaller limits it will be caught by the OS)
        return false;
    }

    std::u32string filename_utf32;
    try {
#if defined(__clang__)
        // disable C++17 deprecation warning for std::codecvt_utf8
#    pragma clang diagnostic push
#    pragma clang diagnostic ignored "-Wdeprecated-declarations"
#endif
        std::wstring_convert<std::codecvt_utf8<char32_t>, char32_t> converter;

#if defined(__clang__)
#    pragma clang diagnostic pop
#endif

        filename_utf32 = converter.from_bytes(filename);

        // If the reverse conversion mismatches, it means overlong UTF-8 sequences were used,
        // or invalid encodings were encountered. Reject such attempts
        std::string filename_reencoded = converter.to_bytes(filename_utf32);
        if (filename_reencoded != filename) {
            return false;
        }
    } catch (const std::exception &) {
        return false;
    }

    // Check for forbidden codepoints:
    // - Control characters
    // - Unicode equivalents of illegal characters
    // - UTF-16 surrogate pairs
    // - UTF-8 replacement character
    // - Byte order mark (BOM)
    // - Illegal characters: / \ : * ? " < > |
    for (char32_t c : filename_utf32) {
        if (c <= 0x1F // Control characters (C0)
            || c == 0x7F // Control characters (DEL)
            || (c >= 0x80 && c <= 0x9F) // Control characters (C1)
            || c == 0xFF0E // Fullwidth Full Stop (period equivalent)
            || c == 0x2215 // Division Slash (forward slash equivalent)
            || c == 0x2216 // Set Minus (backslash equivalent)
            || (c >= 0xD800 && c <= 0xDFFF) // UTF-16 surrogate pairs
            || c == 0xFFFD // Replacement Character (UTF-8)
            || c == 0xFEFF // Byte Order Mark (BOM)
            || c == '/' || c == '\\' || c == ':' || c == '*' // Illegal characters
            || c == '?' || c == '"' || c == '<' || c == '>' || c == '|') {
            return false;
        }
    }

    // Reject any leading or trailing ' ', or any trailing '.', these are stripped on Windows and will cause a different filename
    // Unicode and other whitespace is not affected, only 0x20 space
    if (filename.front() == ' ' || filename.back() == ' ' || filename.back() == '.') {
        return false;
    }

    // Reject any ".." (currently stricter than necessary, it should be fine to just check for == ".." instead)
    if (filename.find("..") != std::string::npos) {
        return false;
    }

    // Reject "."
    if (filename == ".") {
        return false;
    }

    return true;
}